

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/3rdparty/catch.hpp:9840:20)>
::setValue(BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_alecthomas[P]entityx_entityx_3rdparty_catch_hpp:9840:20)>
           *this,string *arg)

{
  ParserResult *in_RDI;
  string *in_stack_00000030;
  anon_class_8_1_50637480_for_m_lambda *in_stack_00000038;
  
  invokeLambda<int,Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
            (in_stack_00000038,in_stack_00000030);
  return in_RDI;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }